

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

int Cudd_PrintLinear(DdManager *table)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong local_38;
  long word;
  int wordsPerRow;
  int nvars;
  int retval;
  int k;
  int j;
  int i;
  DdManager *table_local;
  
  iVar1 = table->linearSize;
  iVar2 = (iVar1 + -1 >> 6) + 1;
  k = 0;
  while( true ) {
    if (iVar1 <= k) {
      return 1;
    }
    for (retval = 0; retval < iVar2; retval = retval + 1) {
      local_38 = table->linear[k * iVar2 + retval];
      for (nvars = 0; nvars < 0x40; nvars = nvars + 1) {
        iVar3 = fprintf((FILE *)table->out,"%ld",local_38 & 1);
        if (iVar3 == 0) {
          return 0;
        }
        local_38 = (long)local_38 >> 1;
      }
    }
    iVar3 = fprintf((FILE *)table->out,"\n");
    if (iVar3 == 0) break;
    k = k + 1;
  }
  return 0;
}

Assistant:

int
Cudd_PrintLinear(
  DdManager * table)
{
    int i,j,k;
    int retval;
    int nvars = table->linearSize;
    int wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    long word;

    for (i = 0; i < nvars; i++) {
        for (j = 0; j < wordsPerRow; j++) {
            word = table->linear[i*wordsPerRow + j];
            for (k = 0; k < BPL; k++) {
                retval = fprintf(table->out,"%ld",word & 1);
                if (retval == 0) return(0);
                word >>= 1;
            }
        }
        retval = fprintf(table->out,"\n");
        if (retval == 0) return(0);
    }
    return(1);

}